

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPool.cpp
# Opt level: O2

void __thiscall psy::C::MemoryPool::~MemoryPool(MemoryPool *this)

{
  int i;
  long lVar1;
  
  if (this->blocks_ != (char **)0x0) {
    for (lVar1 = 0; lVar1 < this->allocatedBlocks_; lVar1 = lVar1 + 1) {
      free(this->blocks_[lVar1]);
    }
    free(this->blocks_);
    return;
  }
  return;
}

Assistant:

MemoryPool::~MemoryPool()
{
    if (blocks_) {
        for (int i = 0; i < allocatedBlocks_; ++i) {
            if (char* b = blocks_[i])
                std::free(b);
        }
        std::free(blocks_);
    }
}